

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall Chainstate::ResetBlockFailureFlags(Chainstate *this,CBlockIndex *pindex)

{
  CBlockIndex *this_00;
  int height;
  pointer ppCVar1;
  ChainstateManager *pCVar2;
  bool bVar3;
  CBlockIndex *pCVar4;
  _Hash_node_base *p_Var5;
  set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *this_01;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<CBlockIndex_*>,_std::_Rb_tree_iterator<CBlockIndex_*>_> pVar6;
  CBlockIndex *local_48;
  CBlockIndex *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var5 = (this->m_blockman->m_block_index)._M_h._M_before_begin._M_nxt;
  local_40 = pindex;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    height = pindex->nHeight;
    do {
      if ((*(uint *)&p_Var5[0x10]._M_nxt & 0x60) != 0 || (*(uint *)&p_Var5[0x10]._M_nxt & 7) < 3) {
        this_00 = (CBlockIndex *)(p_Var5 + 5);
        pCVar4 = CBlockIndex::GetAncestor(this_00,height);
        if (pCVar4 == local_40) {
          *(byte *)&p_Var5[0x10]._M_nxt = *(byte *)&p_Var5[0x10]._M_nxt & 0x9f;
          local_48 = this_00;
          std::
          _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
          ::_M_insert_unique<CBlockIndex*>
                    ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                      *)&this->m_blockman->m_dirty_blockindex,&local_48);
          if ((2 < (*(uint *)&p_Var5[0x10]._M_nxt & 7) &&
               (*(uint *)&p_Var5[0x10]._M_nxt & 0x60) == 0) &&
             (p_Var5[0xf]._M_nxt != (_Hash_node_base *)0x0)) {
            ppCVar1 = (this->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (ppCVar1 ==
                (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start) {
              pCVar4 = (CBlockIndex *)0x0;
            }
            else {
              pCVar4 = ppCVar1[-1];
            }
            bVar3 = ::node::CBlockIndexWorkComparator::operator()
                              ((CBlockIndexWorkComparator *)&local_48,pCVar4,this_00);
            if (bVar3) {
              local_48 = this_00;
              std::
              _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
              ::_M_insert_unique<CBlockIndex*>
                        ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
                          *)&this->setBlockIndexCandidates,&local_48);
            }
          }
          pCVar2 = this->m_chainman;
          if (this_00 == pCVar2->m_best_invalid) {
            pCVar2->m_best_invalid = (CBlockIndex *)0x0;
          }
          local_48 = this_00;
          pVar6 = std::
                  _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                  ::equal_range(&(pCVar2->m_failed_blocks)._M_t,(key_type *)&local_48);
          std::
          _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
          ::_M_erase_aux(&(pCVar2->m_failed_blocks)._M_t,(_Base_ptr)pVar6.first._M_node,
                         (_Base_ptr)pVar6.second._M_node);
        }
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
    if (local_40 == (CBlockIndex *)0x0) goto LAB_003f9e66;
  }
  do {
    if ((local_40->nStatus & 0x60) != 0) {
      local_40->nStatus = local_40->nStatus & 0xffffff9f;
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                  *)&this->m_blockman->m_dirty_blockindex,&local_40);
      this_01 = &this->m_chainman->m_failed_blocks;
      pVar6 = std::
              _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
              ::equal_range(&this_01->_M_t,&local_40);
      std::
      _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
      ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
    }
    local_40 = local_40->pprev;
  } while (local_40 != (CBlockIndex *)0x0);
LAB_003f9e66:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::ResetBlockFailureFlags(CBlockIndex *pindex) {
    AssertLockHeld(cs_main);

    int nHeight = pindex->nHeight;

    // Remove the invalidity flag from this block and all its descendants.
    for (auto& [_, block_index] : m_blockman.m_block_index) {
        if (!block_index.IsValid() && block_index.GetAncestor(nHeight) == pindex) {
            block_index.nStatus &= ~BLOCK_FAILED_MASK;
            m_blockman.m_dirty_blockindex.insert(&block_index);
            if (block_index.IsValid(BLOCK_VALID_TRANSACTIONS) && block_index.HaveNumChainTxs() && setBlockIndexCandidates.value_comp()(m_chain.Tip(), &block_index)) {
                setBlockIndexCandidates.insert(&block_index);
            }
            if (&block_index == m_chainman.m_best_invalid) {
                // Reset invalid block marker if it was pointing to one of those.
                m_chainman.m_best_invalid = nullptr;
            }
            m_chainman.m_failed_blocks.erase(&block_index);
        }
    }

    // Remove the invalidity flag from all ancestors too.
    while (pindex != nullptr) {
        if (pindex->nStatus & BLOCK_FAILED_MASK) {
            pindex->nStatus &= ~BLOCK_FAILED_MASK;
            m_blockman.m_dirty_blockindex.insert(pindex);
            m_chainman.m_failed_blocks.erase(pindex);
        }
        pindex = pindex->pprev;
    }
}